

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void __thiscall Fl_TooltipBox::layout(Fl_TooltipBox *this)

{
  Fl_Font face;
  Fl_Fontsize fsize;
  int iVar1;
  int local_38;
  int local_34;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  Fl_Widget *p;
  int oy;
  int ox;
  int hh;
  int ww;
  Fl_TooltipBox *this_local;
  
  _hh = this;
  face = Fl_Tooltip::font();
  fsize = Fl_Tooltip::size();
  fl_font(face,fsize);
  ox = Fl_Tooltip::wrap_width();
  oy = 0;
  fl_measure(tip,&ox,&oy,1);
  iVar1 = Fl_Tooltip::margin_width();
  ox = iVar1 * 2 + ox;
  iVar1 = Fl_Tooltip::margin_height();
  oy = iVar1 * 2 + oy;
  p._4_4_ = Fl::event_x_root();
  p._0_4_ = ::Y + ::H + 2;
  for (_scr_y = (Fl_Window *)Fl_Tooltip::current(); _scr_y != (Fl_Window *)0x0;
      _scr_y = Fl_Widget::window((Fl_Widget *)_scr_y)) {
    iVar1 = Fl_Widget::y((Fl_Widget *)_scr_y);
    p._0_4_ = iVar1 + (uint)p;
  }
  Fl::screen_xywh(&scr_w,&scr_h,&local_34,&local_38);
  if (scr_w + local_34 < (int)(p._4_4_ + ox)) {
    p._4_4_ = (scr_w + local_34) - ox;
  }
  if ((int)p._4_4_ < scr_w) {
    p._4_4_ = scr_w;
  }
  if (::H < 0x1f) {
    if (scr_h + local_38 < (int)((uint)p + oy)) {
      p._0_4_ = (uint)p - (oy + 4 + ::H);
    }
  }
  else {
    iVar1 = Fl::event_y_root();
    p._0_4_ = iVar1 + 0xd;
    if (scr_h + local_38 < (int)((uint)p + oy)) {
      p._0_4_ = (uint)p - (oy + 0x17);
    }
  }
  if ((int)(uint)p < scr_h) {
    p._0_4_ = scr_h;
  }
  (*(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)p._4_4_,(ulong)(uint)p,(ulong)(uint)ox,(ulong)(uint)oy);
  return;
}

Assistant:

void Fl_TooltipBox::layout() {
  fl_font(Fl_Tooltip::font(), Fl_Tooltip::size());
  int ww = Fl_Tooltip::wrap_width();
  int hh = 0;
  fl_measure(tip, ww, hh, draw_symbols_);
  ww += (Fl_Tooltip::margin_width() * 2);
  hh += (Fl_Tooltip::margin_height() * 2);

  // find position on the screen of the widget:
  int ox = Fl::event_x_root();
  int oy = Y + H+2;
  for (Fl_Widget* p = Fl_Tooltip::current(); p; p = p->window()) {
    oy += p->y();
  }
  int scr_x, scr_y, scr_w, scr_h;
  Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
  if (ox+ww > scr_x+scr_w) ox = scr_x+scr_w - ww;
  if (ox < scr_x) ox = scr_x;
  if (H > 30) {
    oy = Fl::event_y_root()+13;
    if (oy+hh > scr_y+scr_h) oy -= 23+hh;
  } else {
    if (oy+hh > scr_y+scr_h) oy -= (4+hh+H);
  }
  if (oy < scr_y) oy = scr_y;

  resize(ox, oy, ww, hh);
}